

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O2

void __thiscall so_5::stats::impl::std_controller_t::add(std_controller_t *this,source_t *what)

{
  std::mutex::lock(&this->m_data_lock);
  repository_t::source_list_add(what,&this->m_head,&this->m_tail);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_data_lock);
  return;
}

Assistant:

void
std_controller_t::add( source_t & what )
	{
		std::lock_guard< std::mutex > lock{ m_data_lock };

		source_list_add( what, m_head, m_tail );
	}